

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastAndEffectiveFeaturePreservingMeshDenoising.cpp
# Opt level: O0

void __thiscall
FastAndEffectiveFeaturePreservingMeshDenoising::denoise
          (FastAndEffectiveFeaturePreservingMeshDenoising *this)

{
  ParameterSet *this_00;
  bool bVar1;
  size_t sVar2;
  allocator local_289;
  string local_288 [36];
  int local_264;
  undefined1 local_260 [4];
  int vertex_iteration_number;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  filtered_normals;
  undefined1 local_238 [8];
  TriMesh mesh;
  FastAndEffectiveFeaturePreservingMeshDenoising *this_local;
  
  mesh.super_Mesh.
  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>._544_8_
       = this;
  DataManager::getNoisyMesh((TriMesh *)local_238,(this->super_MeshDenoisingBase).data_manager_);
  sVar2 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)local_238);
  if (sVar2 == 0) {
    filtered_normals.
    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  else {
    std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
    vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)
           local_260);
    (*(this->super_MeshDenoisingBase)._vptr_MeshDenoisingBase[2])
              (this,local_238,
               (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *)local_260);
    this_00 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,"Vertex Iteration Num.",&local_289);
    bVar1 = ParameterSet::getValue(this_00,(string *)local_288,&local_264);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
    filtered_normals.
    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = ((bVar1 ^ 0xffU) & 1) != 0;
    if (!filtered_normals.
         super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) {
      MeshDenoisingBase::updateVertexPosition
                (&this->super_MeshDenoisingBase,(TriMesh *)local_238,
                 (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                  *)local_260,local_264,true);
      DataManager::setMesh((this->super_MeshDenoisingBase).data_manager_,(TriMesh *)local_238);
      DataManager::setDenoisedMesh
                ((this->super_MeshDenoisingBase).data_manager_,(TriMesh *)local_238);
    }
    filtered_normals.
    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
    std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
    ~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)
            local_260);
  }
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::~TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_238);
  return;
}

Assistant:

void FastAndEffectiveFeaturePreservingMeshDenoising::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // update face normal
    std::vector<TriMesh::Normal> filtered_normals;
    updateFilteredNormals(mesh, filtered_normals);

    // get parameter for vertex update
    int vertex_iteration_number;
    if(!parameter_set_->getValue(string("Vertex Iteration Num."), vertex_iteration_number))
        return;

    // update vertex position
    updateVertexPosition(mesh, filtered_normals, vertex_iteration_number, true);

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}